

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::TryTableExpr::~TryTableExpr(TryTableExpr *this)

{
  (this->super_ExprMixin<(wabt::ExprType)62>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__TryTableExpr_001aa6c0;
  std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::~vector(&this->catches);
  Block::~Block(&this->block);
  return;
}

Assistant:

explicit TryTableExpr(const Location& loc = Location())
      : ExprMixin<ExprType::TryTable>(loc) {}